

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall irr::video::COpenGLDriver::setMaterial(COpenGLDriver *this,SMaterial *material)

{
  u32 i_00;
  ITexture *pIVar1;
  matrix4 *pmVar2;
  SMaterial *in_RDI;
  SMaterial *in_stack_00000008;
  SOverrideMaterial *in_stack_00000010;
  ITexture *texture;
  u32 i;
  ESetTextureActive in_stack_0000004c;
  ITexture *in_stack_00000050;
  u32 in_stack_0000005c;
  STextureCache *in_stack_00000060;
  SMaterial *in_stack_ffffffffffffffe0;
  uint local_14;
  
  SMaterial::operator=(in_stack_ffffffffffffffe0,in_RDI);
  SOverrideMaterial::apply(in_stack_00000010,in_stack_00000008);
  for (local_14 = 0; local_14 < (byte)in_RDI[9].TextureLayers[2].field_0xb; local_14 = local_14 + 1)
  {
    pIVar1 = SMaterial::getTexture((SMaterial *)&in_RDI[0x13].TextureLayers[2].MagFilter,local_14);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::getTextureCache(*(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                        **)&in_RDI[0x10].TextureLayers[3].field_0x8);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::set(in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_0000004c);
    if (pIVar1 != (ITexture *)0x0) {
      i_00 = local_14 + 3;
      pmVar2 = SMaterial::getTextureMatrix(in_RDI,i_00);
      (*(code *)((in_RDI->TextureLayers[0].Texture)->NamedPath).InternalName.str._M_string_length)
                (in_RDI,i_00,pmVar2);
    }
  }
  return;
}

Assistant:

void COpenGLDriver::setMaterial(const SMaterial &material)
{
	Material = material;
	OverrideMaterial.apply(Material);

	for (u32 i = 0; i < Feature.MaxTextureUnits; ++i) {
		const ITexture *texture = Material.getTexture(i);
		CacheHandler->getTextureCache().set(i, texture, EST_ACTIVE_ON_CHANGE);
		if (texture) {
			setTransform((E_TRANSFORMATION_STATE)(ETS_TEXTURE_0 + i), material.getTextureMatrix(i));
		}
	}
}